

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O2

ostream * Gs::operator<<(ostream *stream,Matrix<float,_2UL,_2UL> *mat)

{
  undefined8 uVar1;
  char cVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  size_t c;
  long lVar7;
  float *pfVar8;
  float *local_78;
  size_t lengths [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar7 = 0;
  pfVar8 = mat->m_;
  for (; lVar7 != 2; lVar7 = lVar7 + 1) {
    lengths[lVar7] = 0;
    uVar6 = 0;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 4) {
      sVar3 = Details::Length<float>((float *)((long)pfVar8 + lVar5));
      if (uVar6 <= sVar3) {
        uVar6 = sVar3;
      }
      lengths[lVar7] = uVar6;
    }
    pfVar8 = pfVar8 + 2;
  }
  lVar7 = 0;
  local_78 = mat->m_;
  for (; lVar7 != 2; lVar7 = lVar7 + 1) {
    cVar2 = '\\';
    if (lVar7 == 0) {
      cVar2 = '/';
    }
    std::operator<<(stream,cVar2);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 8) {
      uVar1 = *(undefined8 *)((long)lengths + lVar5);
      sVar3 = Details::Length<float>((float *)((long)local_78 + lVar5));
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,((char)uVar1 - (char)sVar3) + '\x01');
      std::operator<<(stream,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)stream,*(float *)((long)local_78 + lVar5));
      std::operator<<(poVar4,' ');
    }
    cVar2 = '/';
    if (lVar7 == 0) {
      cVar2 = '\\';
    }
    poVar4 = std::operator<<(stream,cVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_78 = local_78 + 1;
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}